

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfB44Compressor.cpp
# Opt level: O1

int __thiscall
Imf_2_5::B44Compressor::uncompress
          (B44Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  long *plVar1;
  byte bVar2;
  ushort uVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  int i;
  int iVar7;
  int iVar8;
  uint uVar9;
  const_iterator cVar10;
  const_iterator cVar11;
  ConstIterator CVar12;
  InputExc *this_00;
  uint b;
  char *__dest;
  unsigned_short *puVar13;
  long lVar14;
  ChannelData *pCVar15;
  char *pcVar16;
  uint uVar17;
  long lVar18;
  size_t sVar19;
  unsigned_short *__dest_00;
  uint a;
  long lVar20;
  bool bVar21;
  int iVar22;
  int iVar23;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  undefined1 auVar24 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar46;
  int iVar47;
  unsigned_short s [16];
  ushort local_d8 [20];
  unsigned_short *local_b0;
  uint local_a4;
  uint local_a0;
  int local_9c;
  ChannelData *local_98;
  unsigned_short *local_90;
  uint local_88;
  uint local_84;
  unsigned_short *local_80;
  long local_78;
  char **local_70;
  long local_68;
  ulong local_60;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  *outPtr = this->_outBuffer;
  if (inSize == 0) {
    iVar7 = 0;
  }
  else {
    local_b0 = (unsigned_short *)CONCAT44(local_b0._4_4_,(range->min).x);
    local_a0 = (range->max).x;
    if (this->_maxX < (int)local_a0) {
      local_a0 = this->_maxX;
    }
    a = (range->min).y;
    b = (range->max).y;
    if (this->_maxY < (int)b) {
      b = this->_maxY;
    }
    puVar13 = this->_tmpBuffer;
    local_70 = outPtr;
    cVar10._M_node = (_Base_ptr)ChannelList::begin(this->_channels);
    cVar11._M_node = (_Base_ptr)ChannelList::end(this->_channels);
    if (cVar10._M_node != cVar11._M_node) {
      lVar18 = 0;
      do {
        pCVar15 = this->_channelData;
        *(unsigned_short **)((long)&pCVar15->start + lVar18) = puVar13;
        *(unsigned_short **)((long)&pCVar15->end + lVar18) = puVar13;
        iVar7 = numSamples(*(int *)&cVar10._M_node[9].field_0x4,(int)local_b0,local_a0);
        *(int *)((long)&pCVar15->nx + lVar18) = iVar7;
        iVar7 = numSamples(*(int *)&cVar10._M_node[9]._M_parent,a,b);
        *(int *)((long)&pCVar15->ny + lVar18) = iVar7;
        puVar13 = puVar13 + (long)*(int *)((long)&pCVar15->size + lVar18) *
                            (long)iVar7 * (long)*(int *)((long)&pCVar15->nx + lVar18);
        cVar10._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar10._M_node);
        CVar12 = ChannelList::end(this->_channels);
        lVar18 = lVar18 + 0x28;
      } while ((const_iterator)cVar10._M_node != CVar12._i._M_node);
    }
    if (0 < this->_numChans) {
      lVar18 = 0;
      iVar22 = -0x7ffffff1;
      iVar25 = -0x80000000;
      iVar26 = -0x7ffffff1;
      iVar28 = -0x80000000;
      local_48 = -0x7ffffff1;
      iStack_44 = -0x7ffffff1;
      iStack_40 = -0x7ffffff1;
      iStack_3c = -0x7ffffff1;
      local_58 = -0x80000000;
      iStack_54 = -0x80000000;
      iStack_50 = -0x80000000;
      iStack_4c = -0x80000000;
      auVar42 = _DAT_002094a0;
      auVar43 = _DAT_002094b0;
      auVar34 = _DAT_002094c0;
      auVar44 = _DAT_00207ae0;
      auVar45 = _DAT_00207af0;
      iVar7 = iVar22;
      iVar8 = iVar26;
      iVar46 = iVar25;
      iVar47 = iVar28;
      do {
        pCVar15 = this->_channelData + lVar18;
        local_68 = lVar18;
        if (pCVar15->type == HALF) {
          if (0 < pCVar15->ny) {
            local_a4 = 0;
            local_98 = pCVar15;
            do {
              if (0 < pCVar15->nx) {
                lVar18 = (long)pCVar15->nx;
                __dest_00 = pCVar15->start + lVar18 * (int)local_a4;
                local_90 = __dest_00 + lVar18;
                puVar13 = __dest_00 + lVar18 + lVar18;
                local_80 = puVar13 + lVar18;
                local_84 = local_a4 | 3;
                local_88 = local_a4 | 1;
                local_60 = (ulong)(local_a4 | 2);
                uVar17 = 0;
                do {
                  if (inSize < 3) goto LAB_001be444;
                  local_b0 = puVar13;
                  if ((byte)*(ushort *)((long)inPtr + 2) == 0xfc) {
                    uVar3 = (ushort)(byte)*(ushort *)inPtr << 8;
                    local_d8[0] = (ushort)*(byte *)((long)inPtr + 1) | uVar3 & 0x7fff;
                    if (-1 < (short)uVar3) {
                      local_d8[0] = ~CONCAT11((byte)*(ushort *)inPtr,*(byte *)((long)inPtr + 1));
                    }
                    lVar18 = 0;
                    do {
                      auVar24._8_4_ = (int)lVar18;
                      auVar24._0_8_ = lVar18;
                      auVar24._12_4_ = (int)((ulong)lVar18 >> 0x20);
                      auVar29 = (auVar24 | auVar44) ^ auVar45;
                      iVar23 = auVar29._0_4_;
                      iVar27 = auVar29._8_4_;
                      auVar35._4_4_ = iVar23;
                      auVar35._0_4_ = iVar23;
                      auVar35._8_4_ = iVar27;
                      auVar35._12_4_ = iVar27;
                      auVar39._0_4_ = -(uint)(iVar23 < iVar22);
                      auVar39._4_4_ = -(uint)(iVar23 < iVar7);
                      auVar39._8_4_ = -(uint)(iVar27 < iVar26);
                      auVar39._12_4_ = -(uint)(iVar27 < iVar8);
                      auVar30._0_4_ = -(uint)(auVar29._4_4_ == iVar25);
                      auVar30._4_4_ = -(uint)(auVar29._4_4_ == iVar46);
                      auVar30._8_4_ = -(uint)(auVar29._12_4_ == iVar28);
                      auVar30._12_4_ = -(uint)(auVar29._12_4_ == iVar47);
                      auVar30 = auVar30 & auVar39;
                      auVar29 = pshuflw(auVar35,auVar30,0xe8);
                      auVar29 = packssdw(auVar29,auVar29);
                      if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        local_d8[lVar18 + 1] = local_d8[0];
                      }
                      auVar29 = packssdw(auVar30,auVar30);
                      auVar29 = packssdw(auVar29,auVar29);
                      if ((auVar29._0_4_ >> 0x10 & 1) != 0) {
                        local_d8[lVar18 + 2] = local_d8[0];
                      }
                      auVar29 = (auVar24 | auVar34) ^ auVar45;
                      iVar23 = auVar29._0_4_;
                      iVar27 = auVar29._8_4_;
                      auVar36._4_4_ = iVar23;
                      auVar36._0_4_ = iVar23;
                      auVar36._8_4_ = iVar27;
                      auVar36._12_4_ = iVar27;
                      auVar40._0_4_ = -(uint)(iVar23 < iVar22);
                      auVar40._4_4_ = -(uint)(iVar23 < iVar7);
                      auVar40._8_4_ = -(uint)(iVar27 < iVar26);
                      auVar40._12_4_ = -(uint)(iVar27 < iVar8);
                      auVar31._0_4_ = -(uint)(auVar29._4_4_ == iVar25);
                      auVar31._4_4_ = -(uint)(auVar29._4_4_ == iVar46);
                      auVar31._8_4_ = -(uint)(auVar29._12_4_ == iVar28);
                      auVar31._12_4_ = -(uint)(auVar29._12_4_ == iVar47);
                      auVar31 = auVar31 & auVar40;
                      auVar29 = packssdw(auVar36,auVar31);
                      auVar29 = packssdw(auVar29,auVar29);
                      if ((auVar29 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        local_d8[lVar18 + 3] = local_d8[0];
                      }
                      auVar29 = pshufhw(auVar31,auVar31,0x84);
                      auVar29 = packssdw(auVar29,auVar29);
                      if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        local_d8[lVar18 + 4] = local_d8[0];
                      }
                      auVar29 = (auVar24 | auVar43) ^ auVar45;
                      iVar23 = auVar29._0_4_;
                      iVar27 = auVar29._8_4_;
                      auVar37._4_4_ = iVar23;
                      auVar37._0_4_ = iVar23;
                      auVar37._8_4_ = iVar27;
                      auVar37._12_4_ = iVar27;
                      auVar41._0_4_ = -(uint)(iVar23 < iVar22);
                      auVar41._4_4_ = -(uint)(iVar23 < iVar7);
                      auVar41._8_4_ = -(uint)(iVar27 < iVar26);
                      auVar41._12_4_ = -(uint)(iVar27 < iVar8);
                      auVar32._0_4_ = -(uint)(auVar29._4_4_ == iVar25);
                      auVar32._4_4_ = -(uint)(auVar29._4_4_ == iVar46);
                      auVar32._8_4_ = -(uint)(auVar29._12_4_ == iVar28);
                      auVar32._12_4_ = -(uint)(auVar29._12_4_ == iVar47);
                      auVar32 = auVar32 & auVar41;
                      auVar29 = pshuflw(auVar37,auVar32,0xe8);
                      auVar29 = packssdw(auVar29,auVar29);
                      if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        local_d8[lVar18 + 5] = local_d8[0];
                      }
                      auVar29 = packssdw(auVar32,auVar32);
                      auVar29 = packssdw(auVar29,auVar29);
                      if ((auVar29 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        local_d8[lVar18 + 6] = local_d8[0];
                      }
                      auVar24 = (auVar24 | auVar42) ^ auVar45;
                      iVar23 = auVar24._0_4_;
                      iVar27 = auVar24._8_4_;
                      auVar33._4_4_ = iVar23;
                      auVar33._0_4_ = iVar23;
                      auVar33._8_4_ = iVar27;
                      auVar33._12_4_ = iVar27;
                      auVar38._0_4_ = -(uint)(iVar23 < iVar22);
                      auVar38._4_4_ = -(uint)(iVar23 < iVar7);
                      auVar38._8_4_ = -(uint)(iVar27 < iVar26);
                      auVar38._12_4_ = -(uint)(iVar27 < iVar8);
                      auVar29._0_4_ = -(uint)(auVar24._4_4_ == iVar25);
                      auVar29._4_4_ = -(uint)(auVar24._4_4_ == iVar46);
                      auVar29._8_4_ = -(uint)(auVar24._12_4_ == iVar28);
                      auVar29._12_4_ = -(uint)(auVar24._12_4_ == iVar47);
                      auVar29 = auVar29 & auVar38;
                      auVar24 = packssdw(auVar33,auVar29);
                      auVar24 = packssdw(auVar24,auVar24);
                      if ((auVar24 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        local_d8[lVar18 + 7] = local_d8[0];
                      }
                      auVar24 = pshufhw(auVar29,auVar29,0x84);
                      auVar24 = packssdw(auVar24,auVar24);
                      if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        local_d8[lVar18 + 8] = local_d8[0];
                      }
                      lVar18 = lVar18 + 8;
                    } while (lVar18 != 0x10);
                    local_9c = -3;
                    local_78 = 3;
                  }
                  else {
                    if (inSize < 0xe) goto LAB_001be444;
                    local_d8[0] = *(ushort *)inPtr << 8 | *(ushort *)inPtr >> 8;
                    bVar2 = (byte)*(ushort *)((long)inPtr + 2) >> 2;
                    sVar6 = (short)(-0x20 << (bVar2 & 0x1f));
                    sVar5 = local_d8[0] + sVar6;
                    local_d8[4] = (short)((((byte)*(ushort *)((long)inPtr + 2) & 3) << 4 |
                                          (uint)(*(byte *)((long)inPtr + 3) >> 4)) << (bVar2 & 0x1f)
                                         ) + sVar5;
                    iVar7 = (uint)(byte)((byte)*(ushort *)((long)inPtr + 4) >> 6) +
                            (*(byte *)((long)inPtr + 3) & 0xf) * 4;
                    sVar4 = local_d8[4] + sVar6;
                    local_d8[8] = (short)(iVar7 << (bVar2 & 0x1f)) + sVar4;
                    local_d8[0xc] =
                         (short)(((byte)*(ushort *)((long)inPtr + 4) & 0x3f) + iVar7 + -0x20 <<
                                (bVar2 & 0x1f)) + sVar4;
                    local_d8[1] = ((ushort)(*(byte *)((long)inPtr + 5) >> 2) << (bVar2 & 0x1f)) +
                                  sVar5;
                    local_d8[5] = (short)(((*(byte *)((long)inPtr + 5) & 3) << 4 |
                                          (uint)(byte)((byte)*(ushort *)((long)inPtr + 6) >> 4)) <<
                                         (bVar2 & 0x1f)) + sVar4;
                    local_d8[9] = (short)((uint)(*(byte *)((long)inPtr + 7) >> 6) +
                                          ((byte)*(ushort *)((long)inPtr + 6) & 0xf) * 4 <<
                                         (bVar2 & 0x1f)) + sVar6 + local_d8[8];
                    local_d8[0xd] =
                         (short)((*(byte *)((long)inPtr + 7) & 0x3f) << (bVar2 & 0x1f)) + sVar6 +
                         local_d8[0xc];
                    local_d8[2] = ((ushort)(byte)((byte)*(ushort *)((long)inPtr + 8) >> 2) <<
                                  (bVar2 & 0x1f)) + sVar6 + local_d8[1];
                    local_d8[6] = (short)((((byte)*(ushort *)((long)inPtr + 8) & 3) << 4 |
                                          (uint)(*(byte *)((long)inPtr + 9) >> 4)) << (bVar2 & 0x1f)
                                         ) + sVar6 + local_d8[5];
                    local_d8[10] = (short)((uint)(byte)((byte)*(ushort *)((long)inPtr + 10) >> 6) +
                                           (*(byte *)((long)inPtr + 9) & 0xf) * 4 << (bVar2 & 0x1f))
                                   + sVar6 + local_d8[9];
                    local_d8[0xe] =
                         (short)(((byte)*(ushort *)((long)inPtr + 10) & 0x3f) << (bVar2 & 0x1f)) +
                         sVar6 + local_d8[0xd];
                    local_d8[3] = ((ushort)(*(byte *)((long)inPtr + 0xb) >> 2) << (bVar2 & 0x1f)) +
                                  sVar6 + local_d8[2];
                    local_d8[7] = (short)(((*(byte *)((long)inPtr + 0xb) & 3) << 4 |
                                          (uint)(byte)((byte)*(ushort *)((long)inPtr + 0xc) >> 4))
                                         << (bVar2 & 0x1f)) + sVar6 + local_d8[6];
                    local_d8[0xb] =
                         (short)((uint)(*(byte *)((long)inPtr + 0xd) >> 6) +
                                 ((byte)*(ushort *)((long)inPtr + 0xc) & 0xf) * 4 << (bVar2 & 0x1f))
                         + sVar6 + local_d8[10];
                    local_d8[0xf] =
                         (short)((*(byte *)((long)inPtr + 0xd) & 0x3f) << (bVar2 & 0x1f)) + sVar6 +
                         local_d8[0xe];
                    lVar18 = 0;
                    auVar42._8_4_ = 0xffffffff;
                    auVar42._0_8_ = 0xffffffffffffffff;
                    auVar42._12_4_ = 0xffffffff;
                    do {
                      auVar43 = *(undefined1 (*) [16])(local_d8 + lVar18);
                      auVar34._0_2_ = -(ushort)(auVar43._0_2_ < 0);
                      auVar34._2_2_ = -(ushort)(auVar43._2_2_ < 0);
                      auVar34._4_2_ = -(ushort)(auVar43._4_2_ < 0);
                      auVar34._6_2_ = -(ushort)(auVar43._6_2_ < 0);
                      auVar34._8_2_ = -(ushort)(auVar43._8_2_ < 0);
                      auVar34._10_2_ = -(ushort)(auVar43._10_2_ < 0);
                      auVar34._12_2_ = -(ushort)(auVar43._12_2_ < 0);
                      auVar34._14_2_ = -(ushort)(auVar43._14_2_ < 0);
                      *(undefined1 (*) [16])(local_d8 + lVar18) =
                           (auVar34 | auVar43) ^ auVar42 | auVar43 & auVar34 & _DAT_0021a4d0;
                      lVar18 = lVar18 + 8;
                    } while (lVar18 != 0x10);
                    local_9c = -0xe;
                    local_78 = 0xe;
                    pCVar15 = local_98;
                  }
                  if (pCVar15->pLinear == true) {
                    lVar18 = 0;
                    do {
                      local_d8[lVar18] =
                           *(ushort *)
                            ((anonymous_namespace)::logTable + (ulong)local_d8[lVar18] * 2);
                      lVar18 = lVar18 + 1;
                    } while (lVar18 != 0x10);
                  }
                  iVar7 = (pCVar15->nx - uVar17) * 2;
                  if ((int)(uVar17 | 3) < pCVar15->nx) {
                    iVar7 = 8;
                  }
                  sVar19 = (size_t)iVar7;
                  iVar7 = pCVar15->ny;
                  local_a0 = uVar17;
                  memcpy(__dest_00,local_d8,sVar19);
                  if ((int)local_84 < iVar7) {
                    memcpy(local_90,local_d8 + 4,sVar19);
                    puVar13 = local_b0;
                    memcpy(local_b0,local_d8 + 8,sVar19);
                    memcpy(local_80,local_d8 + 0xc,sVar19);
                  }
                  else {
                    if ((int)local_88 < pCVar15->ny) {
                      memcpy(local_90,local_d8 + 4,sVar19);
                      pCVar15 = local_98;
                    }
                    puVar13 = local_b0;
                    if ((int)local_60 < pCVar15->ny) {
                      memcpy(local_b0,local_d8 + 8,sVar19);
                      pCVar15 = local_98;
                    }
                  }
                  inPtr = (char *)((long)inPtr + local_78);
                  inSize = inSize + local_9c;
                  __dest_00 = __dest_00 + 4;
                  local_90 = local_90 + 4;
                  puVar13 = puVar13 + 4;
                  local_80 = local_80 + 4;
                  uVar17 = local_a0 + 4;
                  auVar42 = _DAT_002094a0;
                  auVar43 = _DAT_002094b0;
                  auVar34 = _DAT_002094c0;
                  auVar44 = _DAT_00207ae0;
                  auVar45 = _DAT_00207af0;
                  iVar22 = local_48;
                  iVar7 = iStack_44;
                  iVar26 = iStack_40;
                  iVar8 = iStack_3c;
                  iVar25 = local_58;
                  iVar46 = iStack_54;
                  iVar28 = iStack_50;
                  iVar47 = iStack_4c;
                } while ((int)uVar17 < pCVar15->nx);
              }
              local_a4 = local_a4 + 4;
            } while ((int)local_a4 < pCVar15->ny);
          }
        }
        else {
          iVar8 = pCVar15->nx * pCVar15->ny * pCVar15->size;
          iVar7 = iVar8 * 2;
          if (inSize < iVar7) {
LAB_001be444:
            anon_unknown_0::notEnoughData();
            goto LAB_001be449;
          }
          memcpy(pCVar15->start,inPtr,(long)iVar7);
          inPtr = (char *)((long)inPtr + (long)iVar7);
          auVar42 = _DAT_002094a0;
          auVar43 = _DAT_002094b0;
          auVar34 = _DAT_002094c0;
          auVar44 = _DAT_00207ae0;
          auVar45 = _DAT_00207af0;
          inSize = inSize + iVar8 * -2;
          iVar22 = local_48;
          iVar7 = iStack_44;
          iVar26 = iStack_40;
          iVar8 = iStack_3c;
          iVar25 = local_58;
          iVar46 = iStack_54;
          iVar28 = iStack_50;
          iVar47 = iStack_4c;
        }
        lVar18 = local_68 + 1;
      } while (lVar18 < this->_numChans);
    }
    __dest = this->_outBuffer;
    if (this->_format == XDR) {
      if ((int)a <= (int)b) {
        do {
          if (0 < this->_numChans) {
            local_b0 = (unsigned_short *)(ulong)~a;
            lVar18 = 0;
            do {
              pCVar15 = this->_channelData;
              uVar17 = pCVar15[lVar18].ys;
              if ((int)a < 0) {
                if (-1 < (int)uVar17) {
                  uVar9 = ((int)local_b0 + uVar17) / uVar17;
                  goto LAB_001be25c;
                }
                uVar9 = (~uVar17 - a) / -uVar17;
              }
              else if ((int)uVar17 < 0) {
                uVar9 = a / -uVar17;
LAB_001be25c:
                uVar9 = -uVar9;
              }
              else {
                uVar9 = a / uVar17;
              }
              if (a == uVar9 * uVar17) {
                iVar7 = pCVar15[lVar18].nx;
                if (pCVar15[lVar18].type == HALF) {
                  if (0 < iVar7) {
                    do {
                      pcVar16 = __dest;
                      local_d8[0] = *pCVar15[lVar18].end;
                      lVar14 = 0;
                      do {
                        pcVar16[lVar14] = *(char *)((long)local_d8 + lVar14);
                        lVar14 = lVar14 + 1;
                      } while ((int)lVar14 != 2);
                      pCVar15[lVar18].end = pCVar15[lVar18].end + 1;
                      bVar21 = 1 < iVar7;
                      __dest = pcVar16 + lVar14;
                      iVar7 = iVar7 + -1;
                    } while (bVar21);
                    __dest = pcVar16 + lVar14;
                  }
                }
                else {
                  lVar14 = (long)pCVar15[lVar18].size * (long)iVar7;
                  memcpy(__dest,pCVar15[lVar18].end,lVar14 * 2);
                  __dest = __dest + lVar14 * 2;
                  pCVar15[lVar18].end = pCVar15[lVar18].end + lVar14;
                }
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < this->_numChans);
          }
          bVar21 = a != b;
          a = a + 1;
        } while (bVar21);
      }
    }
    else if ((int)a <= (int)b) {
      do {
        if (0 < this->_numChans) {
          local_b0 = (unsigned_short *)(ulong)~a;
          lVar18 = 8;
          lVar14 = 0;
          do {
            pCVar15 = this->_channelData;
            uVar17 = *(uint *)((long)&pCVar15->nx + lVar18);
            if ((int)a < 0) {
              if ((int)uVar17 < 0) {
                uVar9 = (~uVar17 - a) / -uVar17;
              }
              else {
                uVar9 = -(((int)local_b0 + uVar17) / uVar17);
              }
            }
            else if ((int)uVar17 < 0) {
              uVar9 = -(a / -uVar17);
            }
            else {
              uVar9 = a / uVar17;
            }
            if (a == uVar9 * uVar17) {
              lVar20 = (long)*(int *)((long)&pCVar15->type + lVar18) *
                       (long)*(int *)((long)&pCVar15->end + lVar18);
              sVar19 = lVar20 * 2;
              memcpy(__dest,*(void **)((long)&pCVar15->start + lVar18),sVar19);
              __dest = __dest + lVar20 * 2;
              plVar1 = (long *)((long)&pCVar15->start + lVar18);
              *plVar1 = *plVar1 + sVar19;
            }
            lVar14 = lVar14 + 1;
            lVar18 = lVar18 + 0x28;
          } while (lVar14 < this->_numChans);
        }
        bVar21 = a != b;
        a = a + 1;
      } while (bVar21);
    }
    if (0 < inSize) {
LAB_001be449:
      this_00 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc
                (this_00,"Error decompressing data (input data are longer than expected).");
      __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
    *local_70 = this->_outBuffer;
    iVar7 = (int)__dest - *(int *)&this->_outBuffer;
  }
  return iVar7;
}

Assistant:

int
B44Compressor::uncompress (const char *inPtr,
			   int inSize,
			   IMATH_NAMESPACE::Box2i range,
			   const char *&outPtr)
{
    //
    // This function is the reverse of the compress() function,
    // above.  First all pixels are moved from the input buffer
    // into _tmpBuffer.  UINT and FLOAT channels are copied
    // verbatim; HALF channels are uncompressed in blocks of
    // 4x4 pixels.  Then the pixels in _tmpBuffer are copied
    // into the output buffer and rearranged such that the data
    // for for each scan line form a contiguous block.
    //

    outPtr = _outBuffer;

    if (inSize == 0)
    {
	return 0;
    }

    int minX = range.min.x;
    int maxX = min (range.max.x, _maxX);
    int minY = range.min.y;
    int maxY = min (range.max.y, _maxY);
    
    unsigned short *tmpBufferEnd = _tmpBuffer;
    int i = 0;

    for (ChannelList::ConstIterator c = _channels.begin();
	 c != _channels.end();
	 ++c, ++i)
    {
	ChannelData &cd = _channelData[i];

	cd.start = tmpBufferEnd;
	cd.end = cd.start;

	cd.nx = numSamples (c.channel().xSampling, minX, maxX);
	cd.ny = numSamples (c.channel().ySampling, minY, maxY);

	tmpBufferEnd += cd.nx * cd.ny * cd.size;
    }

    for (int i = 0; i < _numChans; ++i)
    {
	ChannelData &cd = _channelData[i];

	if (cd.type != HALF)
	{
	    //
	    // UINT or FLOAT channel.
	    //

	    int n = cd.nx * cd.ny * cd.size * sizeof (unsigned short);

	    if (inSize < n)
		notEnoughData();

	    memcpy (cd.start, inPtr, n);
	    inPtr += n;
	    inSize -= n;

	    continue;
	}

	//
	// HALF channel
	//

	for (int y = 0; y < cd.ny; y += 4)
	{
	    unsigned short *row0 = cd.start + y * cd.nx;
	    unsigned short *row1 = row0 + cd.nx;
	    unsigned short *row2 = row1 + cd.nx;
	    unsigned short *row3 = row2 + cd.nx;

	    for (int x = 0; x < cd.nx; x += 4)
	    {
		unsigned short s[16]; 

		if (inSize < 3)
		    notEnoughData();

		if (((const unsigned char *)inPtr)[2] == 0xfc)
		{
		    unpack3 ((const unsigned char *)inPtr, s);
		    inPtr += 3;
		    inSize -= 3;
		}
		else
		{
		    if (inSize < 14)
			notEnoughData();

		    unpack14 ((const unsigned char *)inPtr, s);
		    inPtr += 14;
		    inSize -= 14;
		}

		if (cd.pLinear)
		    convertToLinear (s);

		int n = (x + 3 < cd.nx)?
			    4 * sizeof (unsigned short) :
			    (cd.nx - x) * sizeof (unsigned short);

		if (y + 3 < cd.ny)
		{
		    memcpy (row0, &s[ 0], n);
		    memcpy (row1, &s[ 4], n);
		    memcpy (row2, &s[ 8], n);
		    memcpy (row3, &s[12], n);
		}
		else
		{
		    memcpy (row0, &s[ 0], n);

		    if (y + 1 < cd.ny)
			memcpy (row1, &s[ 4], n);

		    if (y + 2 < cd.ny)
			memcpy (row2, &s[ 8], n);
		}

		row0 += 4;
		row1 += 4;
		row2 += 4;
		row3 += 4;
	    }
	}
    }

    char *outEnd = _outBuffer;

    if (_format == XDR)
    {
	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		if (cd.type == HALF)
		{
		    for (int x = cd.nx; x > 0; --x)
		    {
			Xdr::write <CharPtrIO> (outEnd, *cd.end);
			++cd.end;
		    }
		}
		else
		{
		    int n = cd.nx * cd.size;
		    memcpy (outEnd, cd.end, n * sizeof (unsigned short));
		    outEnd += n * sizeof (unsigned short);
		    cd.end += n;
		}
	    }
	}
    }
    else
    {
	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		#if defined (DEBUG)
		    assert (cd.type == HALF);
		#endif

		if (modp (y, cd.ys) != 0)
		    continue;

		int n = cd.nx * cd.size;
		memcpy (outEnd, cd.end, n * sizeof (unsigned short));
		outEnd += n * sizeof (unsigned short);
		cd.end += n;
	    }
	}
    }

    #if defined (DEBUG)

	for (int i = 1; i < _numChans; ++i)
	    assert (_channelData[i-1].end == _channelData[i].start);

	assert (_channelData[_numChans-1].end == tmpBufferEnd);

    #endif

    if (inSize > 0)
	tooMuchData();

    outPtr = _outBuffer;
    return outEnd - _outBuffer;
}